

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.h
# Opt level: O0

void __thiscall
cmQtAutoGeneratorMocUic::JobUicT::JobUicT
          (JobUicT *this,string *sourceFile,string *includerFile,string *includeString)

{
  string *includeString_local;
  string *includerFile_local;
  string *sourceFile_local;
  JobUicT *this_local;
  
  JobT::JobT(&this->super_JobT);
  (this->super_JobT)._vptr_JobT = (_func_int **)&PTR__JobUicT_009b07e0;
  std::__cxx11::string::string((string *)&this->SourceFile,(string *)sourceFile);
  std::__cxx11::string::string((string *)&this->IncluderFile,(string *)includerFile);
  std::__cxx11::string::string((string *)&this->IncludeString,(string *)includeString);
  std::__cxx11::string::string((string *)&this->BuildFile);
  return;
}

Assistant:

JobUicT(std::string&& sourceFile, std::string includerFile,
            std::string&& includeString)
      : SourceFile(std::move(sourceFile))
      , IncluderFile(std::move(includerFile))
      , IncludeString(std::move(includeString))
    {
    }